

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O1

void idx2::CompressBufZstd(buffer *Input,bitstream *Output)

{
  int iVar1;
  long lVar2;
  size_t dstCapacity;
  size_t sVar3;
  int iVar4;
  long lVar5;
  long Bytes;
  buffer local_48;
  
  if (Input->Bytes != 0) {
    dstCapacity = ZSTD_compressBound(Input->Bytes);
    lVar2 = (Output->Stream).Bytes;
    Bytes = lVar2;
    if (lVar2 <= (long)(dstCapacity + 8)) {
      do {
        lVar5 = (Bytes * 3) / 2;
        Bytes = lVar5 + 8;
      } while (lVar5 <= (long)dstCapacity);
    }
    if (Bytes <= lVar2) goto LAB_0018bb8b;
    Bytes = Bytes + 8;
    if (Bytes <= lVar2) goto LAB_0018bb8b;
    if (Mallocator()::Instance == '\0') goto LAB_0018bbc2;
    while( true ) {
      local_48.Data = (byte *)0x0;
      local_48.Bytes = 0;
      local_48.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf(&local_48,Bytes,(Output->Stream).Alloc);
      iVar1 = Output->BitPos + 7;
      iVar4 = Output->BitPos + 0xe;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      MemCopy(&Output->Stream,&local_48,
              (u64)(Output->BitPtr + ((long)(iVar4 >> 3) - (long)(Output->Stream).Data)));
      Output->BitPtr = local_48.Data + ((long)Output->BitPtr - (long)(Output->Stream).Data);
      DeallocBuf(&Output->Stream);
      (Output->Stream).Alloc = local_48.Alloc;
      (Output->Stream).Data = local_48.Data;
      (Output->Stream).Bytes = local_48.Bytes;
LAB_0018bb8b:
      sVar3 = ZSTD_compress((Output->Stream).Data,dstCapacity,Input->Data,Input->Bytes,1);
      if (sVar3 != 0) break;
      CompressBufZstd();
LAB_0018bbc2:
      CompressBufZstd();
    }
    Output->BitPtr = (Output->Stream).Data + sVar3;
  }
  return;
}

Assistant:

void
CompressBufZstd(const buffer& Input, bitstream* Output)
{
  if (Size(Input) == 0)
    return;
  size_t const MaxDstSize = ZSTD_compressBound(Size(Input));
  GrowToAccomodate(Output, MaxDstSize - Size(*Output));
  size_t const CpresSize =
    ZSTD_compress(Output->Stream.Data, MaxDstSize, Input.Data, Size(Input), 1);
  if (CpresSize <= 0)
  {
    fprintf(stderr, "CompressBufZstd failed\n");
    exit(1);
  }
  Output->BitPtr = CpresSize + Output->Stream.Data;
}